

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_conncache_remove_conn(conncache *connc,connectdata *conn)

{
  connectbundle *pcVar1;
  curl_llist_element *e;
  size_t sVar2;
  curl_hash_element *pcVar3;
  curl_llist *pcVar4;
  curl_hash_iterator iter;
  curl_hash_iterator local_30;
  
  pcVar1 = conn->bundle;
  if (pcVar1 != (connectbundle *)0x0) {
    pcVar4 = &pcVar1->conn_list;
    while (e = pcVar4->head, e != (curl_llist_element *)0x0) {
      if ((connectdata *)e->ptr == conn) {
        Curl_llist_remove(&pcVar1->conn_list,e,(void *)0x0);
        sVar2 = pcVar1->num_connections - 1;
        pcVar1->num_connections = sVar2;
        conn->bundle = (connectbundle *)0x0;
        goto LAB_004a629d;
      }
      pcVar4 = (curl_llist *)&e->next;
    }
    sVar2 = pcVar1->num_connections;
LAB_004a629d:
    if ((sVar2 == 0) && (connc != (conncache *)0x0)) {
      Curl_hash_start_iterate(&connc->hash,&local_30);
      do {
        pcVar3 = Curl_hash_next_element(&local_30);
        if (pcVar3 == (curl_hash_element *)0x0) goto LAB_004a62a2;
      } while ((connectbundle *)pcVar3->ptr != pcVar1);
      Curl_hash_delete(&connc->hash,pcVar3->key,pcVar3->key_len);
    }
LAB_004a62a2:
    if (connc != (conncache *)0x0) {
      connc->num_connections = connc->num_connections - 1;
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct conncache *connc,
                                struct connectdata *conn)
{
  struct connectbundle *bundle = conn->bundle;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0) {
      conncache_remove_bundle(connc, bundle);
    }

    if(connc) {
      connc->num_connections--;

      DEBUGF(infof(conn->data, "The cache now contains %"
                   CURL_FORMAT_CURL_OFF_TU " members\n",
                   (curl_off_t) connc->num_connections));
    }
  }
}